

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase207::run(TestCase207 *this)

{
  Type *in_RCX;
  undefined1 local_c1 [25];
  Promise<void> local_a8;
  uint local_94;
  Type TStack_90;
  uint i;
  Promise<void> local_88;
  undefined1 local_78 [8];
  Promise<void> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase207 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  Promise<void>::Promise((Promise<void> *)local_78,(void *)0x0);
  TStack_90.promise = (Promise<void> *)local_78;
  evalLater<kj::(anonymous_namespace)::TestCase207::run()::__0>
            ((kj *)&local_88,&stack0xffffffffffffff70);
  Promise<void>::operator=((Promise<void> *)local_78,&local_88);
  Promise<void>::~Promise(&local_88);
  for (local_94 = 0; local_94 < 1000; local_94 = local_94 + 1) {
    mvCapture<kj::(anonymous_namespace)::TestCase207::run()::__1,kj::Promise<void>&>
              ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:226:44),_kj::Promise<void>_>
                *)(local_c1 + 1),(kj *)local_78,(Promise<void> *)local_c1,in_RCX);
    evalLater<kj::CaptureByMove<kj::(anonymous_namespace)::TestCase207::run()::__1,kj::Promise<void>>>
              ((kj *)&local_a8,
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:226:44),_kj::Promise<void>_>
                *)(local_c1 + 1));
    Promise<void>::operator=((Promise<void> *)local_78,&local_a8);
    Promise<void>::~Promise(&local_a8);
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:226:44),_kj::Promise<void>_>
    ::~CaptureByMove((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:226:44),_kj::Promise<void>_>
                      *)(local_c1 + 1));
  }
  Promise<void>::wait((Promise<void> *)local_78,local_58);
  Promise<void>::~Promise((Promise<void> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, DeepChain2) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  promise.wait(waitScope);
}